

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astVariableDefinitionNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  anon_struct_64_8_77d55576 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *local_20;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.type = 0;
  gcFrame.value = 0;
  gcFrame.localBinding = 0;
  gcFrame.name = 0;
  gcFrame.analyzedTypeExpression = 0;
  gcFrame.analyzedValueExpression = 0;
  gcFrame.variableDefinitionNode = (sysbvm_astVariableDefinitionNode_t *)0x0;
  gcFrame.analyzedNameExpression = 0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 8;
  local_20 = (undefined1 *)&gcFrame;
  sysbvm_stackFrame_pushRecord(&local_38);
  gcFrame.variableDefinitionNode =
       (sysbvm_astVariableDefinitionNode_t *)sysbvm_context_shallowCopy(context,*arguments);
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = ((gcFrame.variableDefinitionNode)->super).sourcePosition;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  sVar3 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  ((gcFrame.variableDefinitionNode)->super).analyzerToken = sVar3;
  gcFrame.analyzedNameExpression =
       sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                 (context,(gcFrame.variableDefinitionNode)->nameExpression,
                  (context->roots).symbolType,arguments[1]);
  (gcFrame.variableDefinitionNode)->nameExpression = gcFrame.analyzedNameExpression;
  if ((gcFrame.variableDefinitionNode)->isMacroSymbol == 0x1f) {
    sysbvm_environment_setNewMacroValueBinding
              (context,arguments[1],((gcFrame.variableDefinitionNode)->super).sourcePosition,
               gcFrame.name,(gcFrame.variableDefinitionNode)->valueExpression);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
    sysbvm_stackFrame_popRecord(&local_38);
    sVar3 = sysbvm_astLiteralNode_create
                      (context,((gcFrame.variableDefinitionNode)->super).sourcePosition,0x2f);
    return sVar3;
  }
  if ((gcFrame.variableDefinitionNode)->typeExpression != 0) {
    gcFrame.analyzedTypeExpression =
         sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                   (context,(gcFrame.variableDefinitionNode)->typeExpression,
                    (context->roots).typeType,arguments[1]);
    _Var2 = sysbvm_astNode_isLiteralNode(context,gcFrame.analyzedTypeExpression);
    if (_Var2) {
      gcFrame.type = sysbvm_astLiteralNode_getValue(gcFrame.analyzedTypeExpression);
    }
  }
  gcFrame.analyzedValueExpression =
       sysbvm_interpreter_analyzeASTWithExpectedTypeExpressionWithEnvironmentAt
                 (context,(gcFrame.variableDefinitionNode)->valueExpression,
                  gcFrame.analyzedTypeExpression,arguments[1],
                  ((gcFrame.variableDefinitionNode)->super).sourcePosition,&gcFrame.type);
  (gcFrame.variableDefinitionNode)->valueExpression = gcFrame.analyzedValueExpression;
  sVar3 = gcFrame.type;
  if (gcFrame.type == 0) {
    if ((gcFrame.variableDefinitionNode)->typeExpression == 0) {
      if ((gcFrame.analyzedValueExpression & 0xf) == 0 && gcFrame.analyzedValueExpression != 0) {
        sVar3 = *(sysbvm_tuple_t *)(gcFrame.analyzedValueExpression + 0x20);
        gcFrame.type = sVar3;
      }
      else {
        sVar3 = 0;
        gcFrame.type = sVar3;
      }
    }
    else {
      sVar3 = 0;
    }
  }
  (gcFrame.variableDefinitionNode)->analyzedValueType = sVar3;
  sVar1 = (gcFrame.variableDefinitionNode)->isMutable;
  if (sVar1 == 0x1f) {
    sVar3 = sysbvm_type_createMemberReferenceType(context,sVar3);
    gcFrame.type = sVar3;
  }
  (gcFrame.variableDefinitionNode)->typeExpression = 0;
  ((gcFrame.variableDefinitionNode)->super).analyzedType = sVar3;
  if (gcFrame.analyzedNameExpression == 0) {
    if (gcFrame.analyzedValueExpression == 0) {
      gcFrame.analyzedValueExpression =
           sysbvm_astLiteralNode_create
                     (context,((gcFrame.variableDefinitionNode)->super).sourcePosition,0);
    }
  }
  else {
    _Var2 = sysbvm_astNode_isLiteralNode(context,gcFrame.analyzedNameExpression);
    if (!_Var2) {
      sysbvm_error("Local definition analyzed name must be a literal node.");
    }
    gcFrame.name = sysbvm_astLiteralNode_getValue(gcFrame.analyzedNameExpression);
    if (sVar1 == 0x1f) {
LAB_001248ad:
      gcFrame.localBinding =
           sysbvm_analysisEnvironment_setNewSymbolLocalBinding
                     (context,arguments[1],((gcFrame.variableDefinitionNode)->super).sourcePosition,
                      gcFrame.name,gcFrame.type);
      (gcFrame.variableDefinitionNode)->binding = gcFrame.localBinding;
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
      sysbvm_stackFrame_popRecord(&local_38);
      return (sysbvm_tuple_t)gcFrame.variableDefinitionNode;
    }
    if (gcFrame.analyzedValueExpression != 0) {
      _Var2 = sysbvm_astNode_isLiteralNode(context,gcFrame.analyzedValueExpression);
      if (!_Var2) goto LAB_001248ad;
      if (gcFrame.analyzedValueExpression != 0) {
        gcFrame.value = sysbvm_astLiteralNode_getValue(gcFrame.analyzedValueExpression);
      }
    }
    gcFrame.analyzedValueExpression =
         sysbvm_astLiteralNode_create
                   (context,((gcFrame.variableDefinitionNode)->super).sourcePosition,gcFrame.value);
    gcFrame.localBinding =
         sysbvm_analysisEnvironment_setNewValueBinding
                   (context,arguments[1],((gcFrame.variableDefinitionNode)->super).sourcePosition,
                    gcFrame.name,gcFrame.value);
    (gcFrame.variableDefinitionNode)->binding = gcFrame.localBinding;
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  sysbvm_stackFrame_popRecord(&local_38);
  return gcFrame.analyzedValueExpression;
}

Assistant:

static sysbvm_tuple_t sysbvm_astVariableDefinitionNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astVariableDefinitionNode_t *variableDefinitionNode;
        sysbvm_tuple_t analyzedNameExpression;
        sysbvm_tuple_t analyzedTypeExpression;
        sysbvm_tuple_t analyzedValueExpression;
        
        sysbvm_tuple_t localBinding;
        sysbvm_tuple_t name;
        sysbvm_tuple_t type;
        sysbvm_tuple_t value;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.variableDefinitionNode = (sysbvm_astVariableDefinitionNode_t*)sysbvm_context_shallowCopy(context, *node);

    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.variableDefinitionNode->super.sourcePosition);
    gcFrame.variableDefinitionNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);

    gcFrame.analyzedNameExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.variableDefinitionNode->nameExpression, context->roots.symbolType, *environment);
    gcFrame.variableDefinitionNode->nameExpression = gcFrame.analyzedNameExpression;

    if(sysbvm_tuple_boolean_decode(gcFrame.variableDefinitionNode->isMacroSymbol))
    {
        sysbvm_environment_setNewMacroValueBinding(context, *environment, gcFrame.variableDefinitionNode->super.sourcePosition, gcFrame.name, gcFrame.variableDefinitionNode->valueExpression);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return sysbvm_astLiteralNode_create(context, gcFrame.variableDefinitionNode->super.sourcePosition, SYSBVM_VOID_TUPLE);
    }

    if(gcFrame.variableDefinitionNode->typeExpression)
    {
        gcFrame.analyzedTypeExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.variableDefinitionNode->typeExpression, context->roots.typeType, *environment);

        if(sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedTypeExpression))
            gcFrame.type = sysbvm_astLiteralNode_getValue(gcFrame.analyzedTypeExpression);
    }

    gcFrame.analyzedValueExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeExpressionWithEnvironmentAt(context, gcFrame.variableDefinitionNode->valueExpression, gcFrame.analyzedTypeExpression, *environment, gcFrame.variableDefinitionNode->super.sourcePosition, &gcFrame.type);
    gcFrame.variableDefinitionNode->valueExpression = gcFrame.analyzedValueExpression;

    // Fallback to the type of the analyzed value.
    if(!gcFrame.type && !gcFrame.variableDefinitionNode->typeExpression)
        gcFrame.type = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedValueExpression);
    gcFrame.variableDefinitionNode->analyzedValueType = gcFrame.type;

    bool isMutable = sysbvm_tuple_boolean_decode(gcFrame.variableDefinitionNode->isMutable);
    if(isMutable)
        gcFrame.type = sysbvm_type_createMemberReferenceType(context, gcFrame.type);

    gcFrame.variableDefinitionNode->typeExpression = SYSBVM_NULL_TUPLE;
    gcFrame.variableDefinitionNode->super.analyzedType = gcFrame.type;
    if(!gcFrame.analyzedNameExpression)
    {
        if(!gcFrame.analyzedValueExpression)
            gcFrame.analyzedValueExpression = sysbvm_astLiteralNode_create(context, gcFrame.variableDefinitionNode->super.sourcePosition, SYSBVM_NULL_TUPLE);

        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.analyzedValueExpression;
    }

    if(!sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedNameExpression))
        sysbvm_error("Local definition analyzed name must be a literal node.");

    gcFrame.name = sysbvm_astLiteralNode_getValue(gcFrame.analyzedNameExpression);
    if(!isMutable &&
        (!gcFrame.analyzedValueExpression || sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedValueExpression)))
    {
        if(gcFrame.analyzedValueExpression)
            gcFrame.value = sysbvm_astLiteralNode_getValue(gcFrame.analyzedValueExpression);
        gcFrame.analyzedValueExpression = sysbvm_astLiteralNode_create(context, gcFrame.variableDefinitionNode->super.sourcePosition, gcFrame.value);
        gcFrame.localBinding = sysbvm_analysisEnvironment_setNewValueBinding(context, *environment, gcFrame.variableDefinitionNode->super.sourcePosition, gcFrame.name, gcFrame.value);
        gcFrame.variableDefinitionNode->binding = gcFrame.localBinding;

        // Replace the node by its literal value.
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.analyzedValueExpression;
    }
    else
    {
        gcFrame.localBinding = sysbvm_analysisEnvironment_setNewSymbolLocalBinding(context, *environment, gcFrame.variableDefinitionNode->super.sourcePosition, gcFrame.name, gcFrame.type);
        gcFrame.variableDefinitionNode->binding = gcFrame.localBinding;
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.variableDefinitionNode;
}